

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O3

tri * load_obj(char *file_name,size_t *tri_count)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  tri *ptVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> tri_vec;
  allocator<char> local_51;
  vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> local_50;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,file_name,&local_51);
  load_obj<float>(&local_50,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  sVar8 = ((long)local_50.
                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_50.
                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
  *tri_count = sVar8;
  if ((long)local_50.
            super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_50.
            super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    ptVar6 = (tri *)0x0;
    if (local_50.
        super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      return (tri *)0x0;
    }
  }
  else {
    ptVar6 = (tri *)malloc((long)local_50.
                                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_50.
                                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    lVar7 = 0x20;
    lVar9 = sVar8 + (sVar8 == 0);
    do {
      puVar1 = (undefined8 *)
               ((long)((local_50.
                        super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->p0).values + lVar7 + -0x20);
      uVar3 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      puVar2 = (undefined8 *)((long)ptVar6->v + lVar7 + -0x20);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      puVar2[2] = uVar4;
      puVar2[3] = uVar5;
      *(undefined4 *)((long)&ptVar6->v[0].x + lVar7) =
           *(undefined4 *)
            ((long)((local_50.
                     super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->p0).values + lVar7);
      lVar7 = lVar7 + 0x24;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  operator_delete(local_50.
                  super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_50.
                        super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_50.
                        super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  return ptVar6;
}

Assistant:

tri* load_obj(const char* file_name, size_t* tri_count) {
    auto tri_vec = load_obj<float>(file_name);
    *tri_count = tri_vec.size();
    if (tri_vec.size() == 0)
        return NULL;
    tri* tris = reinterpret_cast<tri*>(malloc(sizeof(tri) * tri_vec.size()));
    for (size_t i = 0; i < tri_vec.size(); ++i) {
        tris[i].v[0].x = tri_vec[i].p0[0];
        tris[i].v[0].y = tri_vec[i].p0[1];
        tris[i].v[0].z = tri_vec[i].p0[2];
        tris[i].v[1].x = tri_vec[i].p1[0];
        tris[i].v[1].y = tri_vec[i].p1[1];
        tris[i].v[1].z = tri_vec[i].p1[2];
        tris[i].v[2].x = tri_vec[i].p2[0];
        tris[i].v[2].y = tri_vec[i].p2[1];
        tris[i].v[2].z = tri_vec[i].p2[2];
    }
    return tris;
}